

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O3

void duckdb_zstd::ZSTD_buildFSETable
               (ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,U32 *baseValue,
               U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize,int bmi2)

{
  uint uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ushort uVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  size_t s;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  short sVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  if (bmi2 != 0) {
    ZSTD_buildFSETable_body_bmi2
              (dt,normalizedCounter,maxSymbolValue,baseValue,nbAdditionalBits,tableLog,wksp,wkspSize
              );
    return;
  }
  bVar7 = (byte)tableLog;
  uVar13 = 1 << (bVar7 & 0x1f);
  uVar18 = 1;
  uVar1 = uVar13 - 1;
  if (maxSymbolValue + 1 == 0) {
    dt->nextState = 1;
    dt->nbAdditionalBits = '\0';
    dt->nbBits = '\0';
    dt->baseValue = tableLog;
    iVar9 = (uVar13 >> 3) + (uVar13 >> 1) + 3;
  }
  else {
    uVar10 = (ulong)(maxSymbolValue + 1);
    uVar6 = 0;
    uVar11 = (ulong)uVar1;
    do {
      sVar14 = normalizedCounter[uVar6];
      if (sVar14 == -1) {
        dt[uVar11 + 1].baseValue = (U32)uVar6;
        sVar14 = 1;
        uVar11 = (ulong)((int)uVar11 - 1);
      }
      else if ((0x10000 << (bVar7 - 1 & 0x1f)) >> 0x10 <= (int)sVar14) {
        uVar18 = 0;
      }
      *(short *)((long)wksp + uVar6 * 2) = sVar14;
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
    dt->nextState = (short)uVar18;
    dt->nbAdditionalBits = (char)((uint)uVar18 >> 0x10);
    dt->nbBits = (char)((uint)uVar18 >> 0x18);
    dt->baseValue = tableLog;
    auVar4 = _DAT_01d99b10;
    auVar3 = _DAT_01d99b00;
    if ((uint)uVar11 != uVar1) {
      uVar6 = 0;
      uVar16 = 0;
      do {
        sVar14 = normalizedCounter[uVar6];
        if (0 < sVar14) {
          iVar9 = 0;
          do {
            dt[(ulong)uVar16 + 1].baseValue = (U32)uVar6;
            do {
              uVar16 = uVar16 + (uVar13 >> 3) + (uVar13 >> 1) + 3 & uVar1;
            } while ((uint)uVar11 < uVar16);
            iVar9 = iVar9 + 1;
          } while (iVar9 != sVar14);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar10);
      goto LAB_018ea41e;
    }
    uVar11 = 0;
    lVar15 = 0;
    lVar12 = 0;
    do {
      uVar2 = normalizedCounter[uVar11];
      *(long *)((long)wksp + lVar15 + 0x6a) = lVar12;
      if (8 < (long)(short)uVar2) {
        uVar5 = 0x10;
        if (0x10 < uVar2) {
          uVar5 = uVar2;
        }
        uVar17 = (ulong)uVar5 - 9;
        auVar21._8_4_ = (int)uVar17;
        auVar21._0_8_ = uVar17;
        auVar21._12_4_ = (int)(uVar17 >> 0x20);
        auVar19._0_8_ = uVar17 >> 3;
        auVar19._8_8_ = auVar21._8_8_ >> 3;
        auVar19 = auVar19 ^ auVar4;
        uVar6 = 0;
        do {
          auVar20._8_4_ = (int)uVar6;
          auVar20._0_8_ = uVar6;
          auVar20._12_4_ = (int)(uVar6 >> 0x20);
          auVar21 = (auVar20 | auVar3) ^ auVar4;
          if ((bool)(~(auVar19._4_4_ < auVar21._4_4_ ||
                      auVar19._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar19._4_4_) & 1)) {
            *(long *)((long)wksp + uVar6 * 8 + lVar15 + 0x72) = lVar12;
          }
          if (auVar21._12_4_ <= auVar19._12_4_ &&
              (auVar21._8_4_ <= auVar19._8_4_ || auVar21._12_4_ != auVar19._12_4_)) {
            *(long *)((long)wksp + uVar6 * 8 + lVar15 + 0x7a) = lVar12;
          }
          uVar6 = uVar6 + 2;
        } while (((uVar17 >> 3) + 2 & 0xfffffffffffffffe) != uVar6);
      }
      lVar15 = lVar15 + (short)uVar2;
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x101010101010101;
    } while (uVar11 != uVar10);
    iVar9 = (uVar13 >> 3) + 3 + (uVar13 >> 1);
  }
  uVar11 = 0;
  uVar16 = 0;
  do {
    dt[(ulong)(uVar16 & uVar1) + 1].baseValue = (uint)*(byte *)((long)wksp + uVar11 + 0x6a);
    dt[(ulong)(uVar16 + iVar9 & uVar1) + 1].baseValue = (uint)*(byte *)((long)wksp + uVar11 + 0x6b);
    uVar16 = uVar16 + iVar9 * 2 & uVar1;
    uVar11 = uVar11 + 2;
  } while (uVar11 < uVar13);
LAB_018ea41e:
  uVar11 = 0;
  do {
    uVar6 = (ulong)dt[uVar11 + 1].baseValue;
    uVar2 = *(ushort *)((long)wksp + uVar6 * 2);
    *(ushort *)((long)wksp + uVar6 * 2) = uVar2 + 1;
    iVar9 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar9 == 0; iVar9 = iVar9 + -1) {
      }
    }
    bVar8 = bVar7 - (char)iVar9;
    dt[uVar11 + 1].nbBits = bVar8;
    dt[uVar11 + 1].nextState = (uVar2 << (bVar8 & 0x1f)) - (short)uVar13;
    dt[uVar11 + 1].nbAdditionalBits = nbAdditionalBits[uVar6];
    dt[uVar11 + 1].baseValue = baseValue[uVar6];
    uVar11 = uVar11 + 1;
  } while (uVar13 != uVar11);
  return;
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}